

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cc
# Opt level: O3

string * FixPath_abi_cxx11_(string *__return_storage_ptr__,CStringRef path,char sep)

{
  size_type sVar1;
  pointer pcVar2;
  size_type sVar3;
  allocator<char> local_11;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,path.data_,&local_11);
  if ((sep != '/') && (sVar1 = __return_storage_ptr__->_M_string_length, sVar1 != 0)) {
    pcVar2 = (__return_storage_ptr__->_M_dataplus)._M_p;
    sVar3 = 0;
    do {
      if (pcVar2[sVar3] == '/') {
        pcVar2[sVar3] = sep;
      }
      sVar3 = sVar3 + 1;
    } while (sVar1 != sVar3);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string FixPath(fmt::CStringRef path, char sep) {
  std::string fixed(path.c_str());
  if (sep != '/')
    std::replace(fixed.begin(), fixed.end(), '/', sep);
  return fixed;
}